

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_print.c
# Opt level: O2

ssize_t saveString(void *ctx,char *str,size_t len)

{
  void *__dest;
  
  if (len < *(ulong *)((long)ctx + 8)) {
    __dest = *ctx;
    memcpy(__dest,str,len);
    *(size_t *)ctx = (long)__dest + len;
    *(long *)((long)ctx + 8) = *(long *)((long)ctx + 8) - len;
  }
  else {
    len = 0xfffffffffffffff0;
  }
  return len;
}

Assistant:

static ssize_t saveString(void *ctx, const char *str, size_t len)
{
	struct iovec *vec = ctx;
	char *to;
	
	if (len >= vec->iov_len) {
		return MPT_ERROR(MissingData);
	}
	to = memcpy(vec->iov_base, str, len);
	
	vec->iov_base = to + len;
	vec->iov_len -= len;
	
	return len;
}